

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_substring_indexBeyondBounds_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"xxxx01234567xxxx",0x10);
  private_ACUtilsTest_AString_reallocFail = 0;
  pAVar2 = AString_substring(&string,0x10,0xffffffffffffffff);
  if (pAVar2 == (AString *)0x0) {
    string.size = 0;
    pcVar6 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) substring != NULL";
    pcVar5 = "(void*) substring";
    iVar1 = 0x9bd;
    goto LAB_0014eb83;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9bd);
  if ((char *)pAVar2->capacity == (char *)0x8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9be);
    if (pAVar2->buffer == (char *)0x0) {
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (*substring).buffer != NULL";
      pcVar5 = "(void*) (*substring).buffer";
      string.size = (size_t)(char *)0x0;
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9be);
      pcVar6 = pAVar2->buffer;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "(null)";
        string.size = 0x16819b;
      }
      else {
        if (*pcVar6 == '\0') {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9be);
          if ((char *)pAVar2->size != (char *)0x0) {
            pcVar6 = "strlen(\"\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(*substring).size == strlen(\"\")";
            pcVar5 = "(*substring).size";
            string.size = pAVar2->size;
            goto LAB_0014e7b9;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9be);
          if (string.capacity == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9bf);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9bf);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                string.size = 0x16819b;
                pcVar6 = "(null)";
              }
              else {
                iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9bf);
                  if (string.size != 0x10) {
                    pcVar6 = "strlen(\"xxxx01234567xxxx\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(string).size == strlen(\"xxxx01234567xxxx\")";
                    pcVar5 = "(string).size";
                    goto LAB_0014e8ed;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9bf);
                  AString_destruct(pAVar2);
                  pAVar2 = AString_substring(&string,0xffffffffffffffff,4);
                  if (pAVar2 == (AString *)0x0) {
                    string.size = 0;
                    pcVar6 = (char *)0x0;
                    expr = "Assertion \'_ck_x != NULL\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                    pcVar4 = "(void*) substring != NULL";
                    pcVar5 = "(void*) substring";
                    iVar1 = 0x9c2;
                    goto LAB_0014eb83;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9c2);
                  if ((char *)pAVar2->capacity == (char *)0x8) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x9c3);
                    if (pAVar2->buffer == (char *)0x0) {
                      pcVar6 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar4 = "(void*) (*substring).buffer != NULL";
                      pcVar5 = "(void*) (*substring).buffer";
                      string.size = (size_t)(char *)0x0;
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9c3);
                      pcVar6 = pAVar2->buffer;
                      if (pcVar6 == (char *)0x0) {
                        pcVar6 = "(null)";
                        string.size = 0x16819b;
                      }
                      else {
                        if (*pcVar6 == '\0') {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9c3);
                          if ((char *)pAVar2->size != (char *)0x0) {
                            pcVar6 = "strlen(\"\")";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar4 = "(*substring).size == strlen(\"\")";
                            pcVar5 = "(*substring).size";
                            string.size = pAVar2->size;
                            goto LAB_0014ea4a;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9c3);
                          if (string.capacity == 0x10) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x9c4);
                            if (string.buffer == (char *)0x0) {
                              string.size = 0;
                              pcVar6 = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar4 = "(void*) (string).buffer != NULL";
                              pcVar5 = "(void*) (string).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x9c4);
                              pcVar6 = string.buffer;
                              if (string.buffer == (char *)0x0) {
                                pcVar6 = "(null)";
                                string.size = 0x16819b;
                              }
                              else {
                                iVar1 = strcmp("xxxx01234567xxxx",string.buffer);
                                if (iVar1 == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9c4);
                                  if (string.size == 0x10) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x9c4);
                                    AString_destruct(pAVar2);
                                    (*string.deallocator)(string.buffer);
                                    return;
                                  }
                                  pcVar6 = "strlen(\"xxxx01234567xxxx\")";
                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                  pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                  pcVar4 = "(string).size == strlen(\"xxxx01234567xxxx\")";
                                  pcVar5 = "(string).size";
                                  goto LAB_0014eb7e;
                                }
                                string.size = 0x15c553;
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar4 = "(string).buffer == (\"xxxx01234567xxxx\")";
                              pcVar5 = "(string).buffer";
                            }
                          }
                          else {
                            pcVar6 = "(16)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar4 = "(string).capacity == (16)";
                            pcVar5 = "(string).capacity";
                            string.size = string.capacity;
                          }
LAB_0014eb7e:
                          iVar1 = 0x9c4;
                          goto LAB_0014eb83;
                        }
                        string.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar4 = "(*substring).buffer == (\"\")";
                      pcVar5 = "(*substring).buffer";
                    }
                  }
                  else {
                    pcVar6 = "(8)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(*substring).capacity == (8)";
                    pcVar5 = "(*substring).capacity";
                    string.size = pAVar2->capacity;
                  }
LAB_0014ea4a:
                  iVar1 = 0x9c3;
                  goto LAB_0014eb83;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\"xxxx01234567xxxx\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(16)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (16)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_0014e8ed:
          iVar1 = 0x9bf;
          goto LAB_0014eb83;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(*substring).buffer == (\"\")";
      pcVar5 = "(*substring).buffer";
    }
  }
  else {
    pcVar6 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(*substring).capacity == (8)";
    pcVar5 = "(*substring).capacity";
    string.size = pAVar2->capacity;
  }
LAB_0014e7b9:
  iVar1 = 0x9be;
LAB_0014eb83:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_indexBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("xxxx01234567xxxx", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    substring = AString_substring(&string, 16, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, -1, 4);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "xxxx01234567xxxx", 16);
    AString_destruct(substring);
    private_ACUtilsTest_AString_destructTestString(string);
}